

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O2

char16_t foldCase(char16_t ch)

{
  short sVar1;
  Properties *pPVar2;
  
  pPVar2 = QUnicodeTables::qGetProp(ch);
  sVar1 = (short)((uint)(int)(short)pPVar2->cases[3] >> 1);
  if (((int)(short)pPVar2->cases[3] & 1U) == 0) {
    ch = sVar1 + ch;
  }
  else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2) == 1) {
    ch = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2 + 2);
  }
  return ch;
}

Assistant:

static inline char16_t foldCase(char16_t ch) noexcept
{
    return convertCase_helper(ch, QUnicodeTables::CaseFold);
}